

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void do_paint(Terminal *term)

{
  termchar *b;
  _Bool _Var1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  byte bVar7;
  unsigned_short uVar8;
  unsigned_short uVar9;
  unsigned_long bchr;
  termline *destline;
  bool bVar10;
  wchar_t wVar11;
  _Bool _Var12;
  wchar_t wVar13;
  wchar_t *ch;
  void *ptr;
  termline *ptVar14;
  termchar *ptVar15;
  ulong uVar16;
  bool bVar17;
  uint uVar18;
  bool bVar19;
  wchar_t wVar20;
  wchar_t wVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  undefined1 uVar26;
  wchar_t *pwVar27;
  unsigned_long *puVar28;
  undefined1 uVar29;
  ulong uVar30;
  wchar_t wVar31;
  long lVar32;
  ulong uVar33;
  undefined1 uVar34;
  wchar_t wVar35;
  ulong uVar36;
  termchar *ptVar37;
  bool bVar38;
  bool bVar39;
  byte local_e3;
  byte local_e2;
  byte local_e1;
  _Bool local_e0;
  byte local_df;
  byte local_de;
  byte local_dd;
  wchar_t local_c8;
  ulong local_b8;
  size_t chlen;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  chlen = 0x400;
  ch = (wchar_t *)safemalloc(0x400,4,0);
  ptr = safemalloc((long)term->cols,0x20,0);
  wVar11 = L'\0';
  if (term->cursor_on == true) {
    wVar13 = L'\x20000000';
    if ((term->has_focus == true) && (wVar13 = L'\x40000000', term->cblinker == false)) {
      wVar13 = (term->blink_cur ^ 1) << 0x1e;
    }
    wVar11 = wVar13 | 0x10000000;
    if (term->wrapnext == false) {
      wVar11 = wVar13;
    }
  }
  _Var12 = term->rvideo;
  _Var1 = term->in_vbell;
  wVar13 = (term->curs).y;
  uVar36 = (long)wVar13 - (long)term->disptop;
  ptVar14 = lineptr(term,wVar13,L'ᝀ',L'\0');
  wVar13 = (term->curs).x;
  ptVar15 = term_bidi_line(term,ptVar14,(wchar_t)uVar36);
  if (ptVar15 == (termchar *)0x0) {
    ptVar15 = ptVar14->chars;
  }
  else {
    wVar13 = term->post_bidi_cache[uVar36].forward[wVar13];
  }
  if (L'\0' < wVar13) {
    wVar13 = wVar13 - (uint)(ptVar15[(uint)wVar13].chr == 0xdfff);
  }
  if (ptVar14->temporary == true) {
    freetermline(ptVar14);
  }
  wVar21 = term->dispcursy;
  if ((-1 < (long)wVar21) &&
     (((term->curstype != wVar11 || (wVar21 != (wchar_t)uVar36)) || (term->dispcursx != wVar13)))) {
    wVar31 = term->dispcursx;
    ptVar15 = term->disptext[wVar21]->chars + wVar31;
    if ((0 < (long)wVar31) && (ptVar15->chr == 0xdfff)) {
      *(uint *)&ptVar15[-1].attr = (uint)ptVar15[-1].attr | 0x3ffff;
    }
    if ((wVar31 < term->cols + L'\xffffffff') && (ptVar15[1].chr == 0xdfff)) {
      *(uint *)&ptVar15[1].attr = (uint)ptVar15[1].attr | 0x3ffff;
    }
    *(uint *)&ptVar15->attr = (uint)ptVar15->attr | 0x3ffff;
    term->curstype = L'\0';
  }
  term->dispcursx = L'\xffffffff';
  term->dispcursy = L'\xffffffff';
  if (L'\0' < term->rows) {
    local_38 = (ulong)(_Var12 != _Var1) << 0x14;
    local_48 = (ulong)(uint)wVar11;
    local_40 = (ulong)(uint)wVar13;
    uVar33 = 0;
    do {
      wVar31 = (wchar_t)uVar33;
      wVar21 = term->disptop + wVar31;
      ptVar14 = lineptr(term,wVar21,L'᝶',L'\0');
      ptVar15 = term_bidi_line(term,ptVar14,wVar31);
      if (ptVar15 == (termchar *)0x0) {
        ptVar15 = ptVar14->chars;
        pwVar27 = (wchar_t *)0x0;
      }
      else {
        pwVar27 = term->post_bidi_cache[uVar33].backward;
      }
      wVar35 = term->cols;
      uVar30 = (ulong)(uint)wVar35;
      if (L'\0' < wVar35) {
        lVar32 = 6;
        uVar25 = 0;
        do {
          wVar35 = (wchar_t)uVar25;
          if (pwVar27 != (wchar_t *)0x0) {
            wVar35 = pwVar27[uVar25];
          }
          uVar22 = *(ulong *)((long)ptVar15 + lVar32 * 4 + -0x10);
          uVar16 = (ulong)((uint)uVar22 & 0xfffc0000) | 0x20500;
          if (term->ansi_colour != false) {
            uVar16 = uVar22;
          }
          if (term->xterm_256_colour == false) {
            uVar22 = (ulong)((uint)uVar16 & 0xfffffe00) | 0x100;
            if (0xef < ((uint)uVar16 & 0x1f0) - 0x10) {
              uVar22 = uVar16;
            }
            uVar16 = (ulong)((uint)uVar22 & 0xfffc01ff) | 0x20400;
            if (0xef < ((uint)(uVar22 >> 9) & 0x1f0) - 0x10) {
              uVar16 = uVar22;
            }
          }
          if (term->true_colour == true) {
            uVar2 = *(undefined1 *)((long)ptVar15 + lVar32 * 4 + -8);
            uVar29 = *(undefined1 *)((long)ptVar15 + lVar32 * 4 + -7);
            uVar34 = *(undefined1 *)((long)ptVar15 + lVar32 * 4 + -6);
            uVar26 = *(undefined1 *)((long)ptVar15 + lVar32 * 4 + -5);
            uVar3 = *(undefined1 *)((long)ptVar15 + lVar32 * 4 + -4);
            uVar4 = *(undefined1 *)((long)ptVar15 + lVar32 * 4 + -3);
            uVar5 = *(undefined1 *)((long)ptVar15 + lVar32 * 4 + -2);
            uVar6 = *(undefined1 *)((long)ptVar15 + lVar32 * 4 + -1);
          }
          else {
            uVar26 = 0;
            uVar34 = 0;
            uVar29 = 0;
            uVar2 = 0;
            uVar6 = 0;
            uVar5 = 0;
            uVar4 = 0;
            uVar3 = 0;
          }
          uVar22 = *(ulong *)((long)ptVar15 + lVar32 * 4 + -0x18);
          uVar23 = (uint)uVar22 & 0xffffff00;
          if (uVar23 == 0xd800) {
            lVar24 = 0x40c;
LAB_001070f3:
            uVar22 = (ulong)*(int *)((long)term->ucsdata->unitab_scoacs +
                                    (uVar22 & 0xff) * 4 + lVar24 + -0xc);
          }
          else {
            if (uVar23 == 0xda00) {
              lVar24 = 0xc;
              goto LAB_001070f3;
            }
            if (uVar23 == 0xd900) {
              lVar24 = 0xc0c;
              goto LAB_001070f3;
            }
          }
          if (((long)uVar25 < (long)((int)uVar30 + -1)) &&
             (*(long *)((long)&ptVar15->attr + lVar32 * 4) == 0xdfff)) {
            uVar16 = uVar16 | 0x400000;
          }
          if ((term->selstate & ~ABOUT_TO) == DRAGGING) {
            if (term->seltype == LEXICOGRAPHIC) {
              wVar20 = (term->selstart).y;
              bVar38 = (term->selstart).x <= wVar35;
              if (wVar21 != wVar20) {
                bVar38 = wVar20 < wVar21;
              }
              if (bVar38) {
                wVar20 = (term->selend).y;
                bVar38 = wVar35 < (term->selend).x;
                if (wVar21 != wVar20) {
                  bVar38 = wVar21 < wVar20;
                }
                uVar23 = (uint)bVar38;
              }
              else {
                uVar23 = 0;
              }
            }
            else {
              uVar23 = 0;
              if (((term->selstart).y <= wVar21) && ((term->selstart).x <= wVar35)) {
                uVar23 = (uint)(wVar35 < (term->selend).x && wVar21 <= (term->selend).y);
              }
            }
          }
          else {
            uVar23 = 0;
          }
          uVar30 = uVar23 << 0x14 ^ local_38 ^ uVar16;
          if ((term->blink_is_real == true) && ((uVar16 & 0x200000) != 0)) {
            if ((term->has_focus == true) && (term->tblinker == true)) {
              uVar22 = (ulong)term->ucsdata->unitab_line[0x20];
            }
            uVar30 = (ulong)((uint)uVar30 & 0xffdfffff);
          }
          ptVar37 = term->disptext[uVar33]->chars;
          if ((uVar22 == *(ulong *)((long)ptVar37 + lVar32 * 4 + -0x18)) &&
             (uVar16 = *(ulong *)((long)ptVar37 + lVar32 * 4 + -0x10),
             uVar30 == (uVar16 & 0xffffffff0f7fffff))) {
            uVar30 = uVar30 | (uint)uVar16 & 0x800000;
          }
          else if (((uint)uVar30 >> 0x16 & 1) == 0) {
            wVar35 = (*term->win->vt->char_width)(term->win,(wchar_t)uVar22);
            if (wVar35 == L'\x02') {
              uVar30 = uVar30 | 0x800000;
            }
          }
          if ((uVar33 == (uVar36 & 0xffffffff)) && (local_40 == uVar25)) {
            uVar30 = uVar30 | local_48;
            term->curstype = wVar11;
            term->dispcursx = (wchar_t)uVar25;
            term->dispcursy = wVar31;
          }
          *(ulong *)((long)ptr + lVar32 * 4 + -0x10) = uVar30;
          *(ulong *)((long)ptr + lVar32 * 4 + -0x18) = uVar22;
          *(undefined1 *)((long)ptr + lVar32 * 4 + -8) = uVar2;
          *(undefined1 *)((long)ptr + lVar32 * 4 + -7) = uVar29;
          *(undefined1 *)((long)ptr + lVar32 * 4 + -6) = uVar34;
          *(undefined1 *)((long)ptr + lVar32 * 4 + -5) = uVar26;
          *(undefined1 *)((long)ptr + lVar32 * 4 + -4) = uVar3;
          *(undefined1 *)((long)ptr + lVar32 * 4 + -3) = uVar4;
          *(undefined1 *)((long)ptr + lVar32 * 4 + -2) = uVar5;
          *(undefined1 *)((long)ptr + lVar32 * 4 + -1) = uVar6;
          *(undefined4 *)((long)ptr + lVar32 * 4) = 0;
          uVar25 = uVar25 + 1;
          wVar35 = term->cols;
          uVar30 = (ulong)wVar35;
          lVar32 = lVar32 + 8;
        } while ((long)uVar25 < (long)uVar30);
      }
      if (L'\0' < wVar35) {
        ptVar37 = term->disptext[uVar33]->chars;
        uVar25 = 0;
        bVar38 = false;
        uVar30 = 0;
        do {
          if ((ptVar37[uVar25].attr & 0x80000000) != 0) {
            bVar38 = false;
            uVar30 = uVar25 & 0xffffffff;
          }
          if (((ptVar37[uVar25].chr != *(unsigned_long *)((long)ptr + uVar25 * 0x20)) ||
              ((ptVar37[uVar25].attr & 0xffffffff0fffffff) !=
               *(ulong *)((long)ptr + uVar25 * 0x20 + 8))) && (!bVar38)) {
            uVar22 = (ulong)(int)uVar30;
            bVar38 = true;
            if ((long)uVar22 < (long)uVar25) {
              puVar28 = &ptVar37[uVar22].attr;
              do {
                *(uint *)puVar28 = (uint)*puVar28 | 0x3ffff;
                uVar22 = uVar22 + 1;
                puVar28 = puVar28 + 4;
              } while (uVar25 != uVar22);
            }
          }
          if (bVar38) {
            *(uint *)&ptVar37[uVar25].attr = (uint)ptVar37[uVar25].attr | 0x3ffff;
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != (uint)wVar35);
      }
      uVar8 = ptVar14->lattr;
      uVar9 = term->disptext[uVar33]->lattr;
      bVar38 = uVar8 != uVar9;
      term->disptext[uVar33]->lattr = uVar8;
      bVar7 = (term->erase_char).truecolour.fg.enabled;
      local_dd = (term->erase_char).truecolour.fg.r;
      local_de = (term->erase_char).truecolour.fg.g;
      local_df = (term->erase_char).truecolour.fg.b;
      local_e0 = (term->erase_char).truecolour.bg.enabled;
      local_e1 = (term->erase_char).truecolour.bg.r;
      local_e2 = (term->erase_char).truecolour.bg.g;
      local_e3 = (term->erase_char).truecolour.bg.b;
      if (term->cols < L'\x01') {
        local_b8 = 0;
        local_c8 = L'\0';
        wVar21 = L'\0';
      }
      else {
        bVar38 = uVar8 != uVar9;
        wVar35 = L'\0';
        bVar10 = false;
        uVar30 = 0;
        local_c8 = L'\0';
        uVar23 = 0;
        local_b8 = 0;
        bVar19 = bVar38;
        do {
          wVar21 = (wchar_t)uVar30;
          lVar32 = (long)wVar35;
          lVar24 = lVar32 * 0x20;
          uVar25 = *(ulong *)((long)ptr + lVar24 + 8);
          ptVar37 = term->disptext[uVar33]->chars;
          if ((((uint)ptVar37[lVar32].attr ^ (uint)uVar25) >> 0x16 & 1) != 0) {
            bVar19 = true;
          }
          bVar39 = ((uVar25 ^ local_b8) & (long)term->attr_mask) != 0;
          if ((((*(byte *)((long)ptr + lVar24 + 0x10) != (bVar7 & 1)) ||
               (*(byte *)((long)ptr + lVar24 + 0x11) != local_dd)) ||
              ((*(byte *)((long)ptr + lVar24 + 0x12) != local_de ||
               ((*(byte *)((long)ptr + lVar24 + 0x13) != local_df ||
                (*(byte *)((long)ptr + lVar24 + 0x14) != (local_e0 & 1U))))))) ||
             ((*(byte *)((long)ptr + lVar24 + 0x15) != local_e1 ||
              ((*(byte *)((long)ptr + lVar24 + 0x16) != local_e2 ||
               (*(byte *)((long)ptr + lVar24 + 0x17) != local_e3)))))) {
            bVar39 = true;
          }
          b = ptVar15 + lVar32;
          bchr = *(unsigned_long *)((long)ptr + lVar24);
          wVar20 = (wchar_t)bchr;
          uVar18 = 0;
          if ((wVar20 & 0xfffffe00U) == 0xdc00) {
            uVar18 = wVar20 & 0xffffff00U;
          }
          if ((wVar20 & 0xfffffc00U) == 0xd800) {
            uVar18 = wVar20 & 0xffffff00U;
          }
          if (uVar18 != uVar23) {
            bVar39 = true;
          }
          if ((b->cc_next != L'\0') || ((L'\0' < wVar35 && (b[-1].cc_next != L'\0')))) {
            bVar39 = true;
          }
          if ((b->chr == 0xdffe) ||
             (((L'\x01' < wVar35 && (b[-1].chr == 0xdfff)) && (b[-2].chr == 0xdffe)))) {
            bVar39 = true;
          }
          bVar17 = bVar39;
          if (((term->ucsdata->dbcs_screenfont == false) && (!bVar19)) &&
             ((((ptVar37[lVar32].chr != bchr ||
                (((ptVar37[lVar32].attr & 0xffffffff0fffffff) != uVar25 ||
                 (ptVar37[lVar32].truecolour.fg.enabled != (_Bool)(bVar7 & 1))))) ||
               (ptVar37[lVar32].truecolour.fg.r != local_dd)) ||
              (((((ptVar37[lVar32].truecolour.fg.g != local_de ||
                  (ptVar37[lVar32].truecolour.fg.b != local_df)) ||
                 (ptVar37[lVar32].truecolour.bg.enabled != (_Bool)(local_e0 & 1U))) ||
                ((ptVar37[lVar32].truecolour.bg.r != local_e1 ||
                 (ptVar37[lVar32].truecolour.bg.g != local_e2)))) ||
               (bVar17 = true, ptVar37[lVar32].truecolour.bg.b != local_e3)))))) {
            bVar17 = bVar39;
            if (wVar21 == L'\x01') {
              bVar17 = true;
            }
            if (bVar38) {
              bVar17 = bVar39;
            }
          }
          if (bVar17) {
            if (((bVar38) || (bVar10)) && (L'\0' < wVar21)) {
              do_paint_draw(term,ptVar14,local_c8,wVar31,ch,wVar21,local_b8,
                            (truecolour)
                            ((ulong)((uint)local_e0 |
                                    (uint)local_e1 << 8 |
                                    (uint)local_e2 << 0x10 | (uint)local_e3 << 0x18) << 0x20 |
                            (ulong)bVar7 |
                            (ulong)((uint)local_dd << 8 |
                                   (uint)local_de << 0x10 | (uint)local_df << 0x18)));
            }
            bVar7 = *(byte *)((long)ptr + lVar24 + 0x10);
            local_dd = *(byte *)((long)ptr + lVar24 + 0x11);
            local_de = *(byte *)((long)ptr + lVar24 + 0x12);
            local_df = *(byte *)((long)ptr + lVar24 + 0x13);
            local_e0 = *(_Bool *)((long)ptr + lVar24 + 0x14);
            local_e1 = *(byte *)((long)ptr + lVar24 + 0x15);
            local_e2 = *(byte *)((long)ptr + lVar24 + 0x16);
            local_e3 = *(byte *)((long)ptr + lVar24 + 0x17);
            if (term->ucsdata->dbcs_screenfont != false) {
              bVar10 = bVar38;
            }
            wVar21 = L'\0';
            local_c8 = wVar35;
            local_b8 = uVar25;
            uVar23 = uVar18;
            bVar38 = bVar19;
          }
          _Var12 = termchars_equal_override(term->disptext[uVar33]->chars + lVar32,b,bchr,uVar25);
          if (!_Var12) {
            bVar38 = true;
          }
          ch = (wchar_t *)safegrowarray(ch,&chlen,4,(long)wVar21,2,false);
          uVar30 = (ulong)(uint)(wVar21 + L'\x01');
          ch[wVar21] = wVar20;
          if (b->cc_next != L'\0') {
            wVar20 = b->cc_next;
            if (wVar20 != L'\0') {
              uVar30 = (ulong)(wVar21 + L'\x01');
              ptVar37 = b;
              do {
                wVar21 = (wchar_t)ptVar37[wVar20].chr;
                uVar18 = wVar21 & 0xffffff00;
                if (uVar18 == 0xd800) {
                  lVar24 = 0x40c;
LAB_001078ea:
                  wVar21 = *(wchar_t *)
                            ((long)term->ucsdata->unitab_scoacs +
                            (ptVar37[wVar20].chr & 0xff) * 4 + lVar24 + -0xc);
                }
                else {
                  if (uVar18 == 0xda00) {
                    lVar24 = 0xc;
                    goto LAB_001078ea;
                  }
                  if (uVar18 == 0xd900) {
                    lVar24 = 0xc0c;
                    goto LAB_001078ea;
                  }
                }
                ptVar37 = ptVar37 + wVar20;
                ch = (wchar_t *)safegrowarray(ch,&chlen,4,uVar30,2,false);
                ch[uVar30] = wVar21;
                uVar30 = uVar30 + 1;
                wVar20 = ptVar37->cc_next;
              } while (wVar20 != L'\0');
            }
            local_b8 = local_b8 | 0x80000000;
          }
          wVar21 = (wchar_t)uVar30;
          if (!_Var12) {
            copy_termchar(term->disptext[uVar33],wVar35,b);
            ptVar37 = term->disptext[uVar33]->chars;
            ptVar37[lVar32].chr = bchr;
            ptVar37[lVar32].attr = uVar25;
            ptVar37[lVar32].truecolour.fg.enabled = (_Bool)bVar7;
            ptVar37[lVar32].truecolour.fg.r = local_dd;
            ptVar37[lVar32].truecolour.fg.g = local_de;
            ptVar37[lVar32].truecolour.fg.b = local_df;
            ptVar37[lVar32].truecolour.bg.enabled = local_e0;
            ptVar37[lVar32].truecolour.bg.r = local_e1;
            ptVar37[lVar32].truecolour.bg.g = local_e2;
            ptVar37[lVar32].truecolour.bg.b = local_e3;
            if (local_c8 == wVar35) {
              puVar28 = &term->disptext[uVar33]->chars[lVar32].attr;
              *puVar28 = *puVar28 | 0x80000000;
            }
          }
          if ((((uint)uVar25 >> 0x16 & 1) != 0) && (wVar35 = wVar35 + L'\x01', wVar35 < term->cols))
          {
            if ((uVar33 == (uVar36 & 0xffffffff)) && (wVar35 == wVar13)) {
              __assert_fail("!(i == our_curs_y && j == our_curs_x)",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                            ,0x189a,"void do_paint(Terminal *)");
            }
            destline = term->disptext[uVar33];
            _Var12 = termchars_equal_override(destline->chars + wVar35,b + 1,b[1].chr,b[1].attr);
            if (!_Var12) {
              bVar38 = true;
            }
            copy_termchar(destline,wVar35,b + 1);
          }
          wVar35 = wVar35 + L'\x01';
        } while (wVar35 < term->cols);
      }
      if ((bVar38) && (L'\0' < wVar21)) {
        do_paint_draw(term,ptVar14,local_c8,wVar31,ch,wVar21,local_b8,
                      (truecolour)
                      ((ulong)((uint)local_e0 |
                              (uint)local_e1 << 8 | (uint)local_e2 << 0x10 | (uint)local_e3 << 0x18)
                       << 0x20 |
                      (ulong)bVar7 |
                      (ulong)((uint)local_dd << 8 | (uint)local_de << 0x10 | (uint)local_df << 0x18)
                      ));
      }
      if (ptVar14->temporary == true) {
        freetermline(ptVar14);
      }
      uVar33 = uVar33 + 1;
    } while ((long)uVar33 < (long)term->rows);
  }
  safefree(ptr);
  safefree(ch);
  return;
}

Assistant:

static void do_paint(Terminal *term)
{
    int i, j, our_curs_y, our_curs_x;
    int rv, cursor;
    pos scrpos;
    wchar_t *ch;
    size_t chlen;
    termchar *newline;

    chlen = 1024;
    ch = snewn(chlen, wchar_t);

    newline = snewn(term->cols, termchar);

    rv = (!term->rvideo ^ !term->in_vbell ? ATTR_REVERSE : 0);

    /* Depends on:
     * screen array, disptop, scrtop,
     * selection, rv,
     * blinkpc, blink_is_real, tblinker,
     * curs.y, curs.x, cblinker, blink_cur, cursor_on, has_focus, wrapnext
     */

    /* Has the cursor position or type changed ? */
    if (term->cursor_on) {
        if (term->has_focus) {
            if (term->cblinker || !term->blink_cur)
                cursor = TATTR_ACTCURS;
            else
                cursor = 0;
        } else
            cursor = TATTR_PASCURS;
        if (term->wrapnext)
            cursor |= TATTR_RIGHTCURS;
    } else
        cursor = 0;
    our_curs_y = term->curs.y - term->disptop;
    {
        /*
         * Adjust the cursor position:
         *  - for bidi
         *  - in the case where it's resting on the right-hand half
         *    of a CJK wide character. xterm's behaviour here,
         *    which seems adequate to me, is to display the cursor
         *    covering the _whole_ character, exactly as if it were
         *    one space to the left.
         */
        termline *ldata = lineptr(term->curs.y);
        termchar *lchars;

        our_curs_x = term->curs.x;

        if ( (lchars = term_bidi_line(term, ldata, our_curs_y)) != NULL) {
            our_curs_x = term->post_bidi_cache[our_curs_y].forward[our_curs_x];
        } else
            lchars = ldata->chars;

        if (our_curs_x > 0 &&
            lchars[our_curs_x].chr == UCSWIDE)
            our_curs_x--;

        unlineptr(ldata);
    }

    /*
     * If the cursor is not where it was last time we painted, and
     * its previous position is visible on screen, invalidate its
     * previous position.
     */
    if (term->dispcursy >= 0 &&
        (term->curstype != cursor ||
         term->dispcursy != our_curs_y ||
         term->dispcursx != our_curs_x)) {
        termchar *dispcurs = term->disptext[term->dispcursy]->chars +
            term->dispcursx;

        if (term->dispcursx > 0 && dispcurs->chr == UCSWIDE)
            dispcurs[-1].attr |= ATTR_INVALID;
        if (term->dispcursx < term->cols-1 && dispcurs[1].chr == UCSWIDE)
            dispcurs[1].attr |= ATTR_INVALID;
        dispcurs->attr |= ATTR_INVALID;

        term->curstype = 0;
    }
    term->dispcursx = term->dispcursy = -1;

    /* The normal screen data */
    for (i = 0; i < term->rows; i++) {
        termline *ldata;
        termchar *lchars;
        bool dirty_line, dirty_run, selected;
        unsigned long attr = 0, cset = 0;
        int start = 0;
        int ccount = 0;
        bool last_run_dirty = false;
        int laststart;
        bool dirtyrect;
        int *backward;
        truecolour tc;

        scrpos.y = i + term->disptop;
        ldata = lineptr(scrpos.y);

        /* Do Arabic shaping and bidi. */
        lchars = term_bidi_line(term, ldata, i);
        if (lchars) {
            backward = term->post_bidi_cache[i].backward;
        } else {
            lchars = ldata->chars;
            backward = NULL;
        }

        /*
         * First loop: work along the line deciding what we want
         * each character cell to look like.
         */
        for (j = 0; j < term->cols; j++) {
            unsigned long tattr, tchar;
            termchar *d = lchars + j;
            scrpos.x = backward ? backward[j] : j;

            tchar = d->chr;
            tattr = d->attr;

            if (!term->ansi_colour)
                tattr = (tattr & ~(ATTR_FGMASK | ATTR_BGMASK)) |
                ATTR_DEFFG | ATTR_DEFBG;

            if (!term->xterm_256_colour) {
                int colour;
                colour = (tattr & ATTR_FGMASK) >> ATTR_FGSHIFT;
                if (colour >= 16 && colour < 256)
                    tattr = (tattr &~ ATTR_FGMASK) | ATTR_DEFFG;
                colour = (tattr & ATTR_BGMASK) >> ATTR_BGSHIFT;
                if (colour >= 16 && colour < 256)
                    tattr = (tattr &~ ATTR_BGMASK) | ATTR_DEFBG;
            }

            if (term->true_colour) {
                tc = d->truecolour;
            } else {
                tc.fg = tc.bg = optionalrgb_none;
            }

            switch (tchar & CSET_MASK) {
              case CSET_ASCII:
                tchar = term->ucsdata->unitab_line[tchar & 0xFF];
                break;
              case CSET_LINEDRW:
                tchar = term->ucsdata->unitab_xterm[tchar & 0xFF];
                break;
              case CSET_SCOACS:
                tchar = term->ucsdata->unitab_scoacs[tchar&0xFF];
                break;
            }
            if (j < term->cols-1 && d[1].chr == UCSWIDE)
                tattr |= ATTR_WIDE;

            /* Video reversing things */
            if (term->selstate == DRAGGING || term->selstate == SELECTED) {
                if (term->seltype == LEXICOGRAPHIC)
                    selected = (posle(term->selstart, scrpos) &&
                                poslt(scrpos, term->selend));
                else
                    selected = (posPle(term->selstart, scrpos) &&
                                posPle_left(scrpos, term->selend));
            } else
                selected = false;
            tattr = (tattr ^ rv
                     ^ (selected ? ATTR_REVERSE : 0));

            /* 'Real' blinking ? */
            if (term->blink_is_real && (tattr & ATTR_BLINK)) {
                if (term->has_focus && term->tblinker) {
                    tchar = term->ucsdata->unitab_line[(unsigned char)' '];
                }
                tattr &= ~ATTR_BLINK;
            }

            /*
             * Check the font we'll _probably_ be using to see if
             * the character is wide when we don't want it to be.
             */
            if (tchar != term->disptext[i]->chars[j].chr ||
                tattr != (term->disptext[i]->chars[j].attr &~
                          (ATTR_NARROW | DATTR_MASK))) {
                if ((tattr & ATTR_WIDE) == 0 &&
                    win_char_width(term->win, tchar) == 2)
                    tattr |= ATTR_NARROW;
            } else if (term->disptext[i]->chars[j].attr & ATTR_NARROW)
                tattr |= ATTR_NARROW;

            if (i == our_curs_y && j == our_curs_x) {
                tattr |= cursor;
                term->curstype = cursor;
                term->dispcursx = j;
                term->dispcursy = i;
            }

            /* FULL-TERMCHAR */
            newline[j].attr = tattr;
            newline[j].chr = tchar;
            newline[j].truecolour = tc;
            /* Combining characters are still read from lchars */
            newline[j].cc_next = 0;
        }

        /*
         * Now loop over the line again, noting where things have
         * changed.
         *
         * During this loop, we keep track of where we last saw
         * DATTR_STARTRUN. Any mismatch automatically invalidates
         * _all_ of the containing run that was last printed: that
         * is, any rectangle that was drawn in one go in the
         * previous update should be either left completely alone
         * or overwritten in its entirety. This, along with the
         * expectation that front ends clip all text runs to their
         * bounding rectangle, should solve any possible problems
         * with fonts that overflow their character cells.
         */
        laststart = 0;
        dirtyrect = false;
        for (j = 0; j < term->cols; j++) {
            if (term->disptext[i]->chars[j].attr & DATTR_STARTRUN) {
                laststart = j;
                dirtyrect = false;
            }

            if (term->disptext[i]->chars[j].chr != newline[j].chr ||
                (term->disptext[i]->chars[j].attr &~ DATTR_MASK)
                != newline[j].attr) {
                int k;

                if (!dirtyrect) {
                    for (k = laststart; k < j; k++)
                        term->disptext[i]->chars[k].attr |= ATTR_INVALID;

                    dirtyrect = true;
                }
            }

            if (dirtyrect)
                term->disptext[i]->chars[j].attr |= ATTR_INVALID;
        }

        /*
         * Finally, loop once more and actually do the drawing.
         */
        dirty_run = dirty_line = (ldata->lattr !=
                                  term->disptext[i]->lattr);
        term->disptext[i]->lattr = ldata->lattr;

        tc = term->erase_char.truecolour;
        for (j = 0; j < term->cols; j++) {
            unsigned long tattr, tchar;
            bool break_run, do_copy;
            termchar *d = lchars + j;

            tattr = newline[j].attr;
            tchar = newline[j].chr;

            if ((term->disptext[i]->chars[j].attr ^ tattr) & ATTR_WIDE)
                dirty_line = true;

            break_run = ((tattr ^ attr) & term->attr_mask) != 0;

            if (!truecolour_equal(newline[j].truecolour, tc))
                break_run = true;

#ifdef USES_VTLINE_HACK
            /* Special hack for VT100 Linedraw glyphs */
            if ((tchar >= 0x23BA && tchar <= 0x23BD) ||
                (j > 0 && (newline[j-1].chr >= 0x23BA &&
                           newline[j-1].chr <= 0x23BD)))
                break_run = true;
#endif

            /*
             * Separate out sequences of characters that have the
             * same CSET, if that CSET is a magic one.
             */
            if (CSET_OF(tchar) != cset)
                break_run = true;

            /*
             * Break on both sides of any combined-character cell.
             */
            if (d->cc_next != 0 ||
                (j > 0 && d[-1].cc_next != 0))
                break_run = true;

            /*
             * Break on both sides of a trust sigil.
             */
            if (d->chr == TRUST_SIGIL_CHAR ||
                (j >= 2 && d[-1].chr == UCSWIDE &&
                 d[-2].chr == TRUST_SIGIL_CHAR))
                break_run = true;

            if (!term->ucsdata->dbcs_screenfont && !dirty_line) {
                if (term->disptext[i]->chars[j].chr == tchar &&
                    (term->disptext[i]->chars[j].attr &~ DATTR_MASK)==tattr &&
                    truecolour_equal(
                        term->disptext[i]->chars[j].truecolour, tc))
                    break_run = true;
                else if (!dirty_run && ccount == 1)
                    break_run = true;
            }

            if (break_run) {
                if ((dirty_run || last_run_dirty) && ccount > 0)
                    do_paint_draw(term, ldata, start, i, ch, ccount, attr, tc);
                start = j;
                ccount = 0;
                attr = tattr;
                tc = newline[j].truecolour;
                cset = CSET_OF(tchar);
                if (term->ucsdata->dbcs_screenfont)
                    last_run_dirty = dirty_run;
                dirty_run = dirty_line;
            }

            do_copy = false;
            if (!termchars_equal_override(&term->disptext[i]->chars[j],
                                          d, tchar, tattr)) {
                do_copy = true;
                dirty_run = true;
            }

            sgrowarrayn(ch, chlen, ccount, 2);

#ifdef PLATFORM_IS_UTF16
            if (tchar > 0x10000 && tchar < 0x110000) {
                ch[ccount++] = (wchar_t) HIGH_SURROGATE_OF(tchar);
                ch[ccount++] = (wchar_t) LOW_SURROGATE_OF(tchar);
            } else
#endif /* PLATFORM_IS_UTF16 */
            ch[ccount++] = (wchar_t) tchar;

            if (d->cc_next) {
                termchar *dd = d;

                while (dd->cc_next) {
                    unsigned long schar;

                    dd += dd->cc_next;

                    schar = dd->chr;
                    switch (schar & CSET_MASK) {
                      case CSET_ASCII:
                        schar = term->ucsdata->unitab_line[schar & 0xFF];
                        break;
                      case CSET_LINEDRW:
                        schar = term->ucsdata->unitab_xterm[schar & 0xFF];
                        break;
                      case CSET_SCOACS:
                        schar = term->ucsdata->unitab_scoacs[schar&0xFF];
                        break;
                    }

                    sgrowarrayn(ch, chlen, ccount, 2);

#ifdef PLATFORM_IS_UTF16
                    if (schar > 0x10000 && schar < 0x110000) {
                        ch[ccount++] = (wchar_t) HIGH_SURROGATE_OF(schar);
                        ch[ccount++] = (wchar_t) LOW_SURROGATE_OF(schar);
                    } else
#endif /* PLATFORM_IS_UTF16 */
                    ch[ccount++] = (wchar_t) schar;
                }

                attr |= TATTR_COMBINING;
            }

            if (do_copy) {
                copy_termchar(term->disptext[i], j, d);
                term->disptext[i]->chars[j].chr = tchar;
                term->disptext[i]->chars[j].attr = tattr;
                term->disptext[i]->chars[j].truecolour = tc;
                if (start == j)
                    term->disptext[i]->chars[j].attr |= DATTR_STARTRUN;
            }

            /* If it's a wide char step along to the next one. */
            if (tattr & ATTR_WIDE) {
                if (++j < term->cols) {
                    d++;
                    /*
                     * By construction above, the cursor should not
                     * be on the right-hand half of this character.
                     * Ever.
                     */
                    assert(!(i == our_curs_y && j == our_curs_x));
                    if (!termchars_equal(&term->disptext[i]->chars[j], d))
                        dirty_run = true;
                    copy_termchar(term->disptext[i], j, d);
                }
            }
        }
        if (dirty_run && ccount > 0)
            do_paint_draw(term, ldata, start, i, ch, ccount, attr, tc);

        unlineptr(ldata);
    }

    sfree(newline);
    sfree(ch);
}